

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O2

int Gia_ManSimParamRead(char *pFileName,int *pnIns,int *pnWords)

{
  bool bVar1;
  uint uVar2;
  FILE *__stream;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for reading.\n",pFileName);
    return 0;
  }
  uVar5 = 0;
  uVar10 = 0;
  uVar7 = 0xffffffffffffffff;
  do {
    iVar9 = (int)uVar10;
    bVar1 = true;
    do {
      do {
        bVar3 = bVar1;
        uVar2 = fgetc(__stream);
        bVar1 = false;
      } while (uVar2 == 0x2e);
      iVar6 = (int)uVar7;
      if (uVar2 == 0xffffffff) {
        if ((int)(uVar5 & 0x8000003f) < 1) {
          *pnIns = iVar6 + -1;
          *pnWords = (int)uVar5 / 0x40;
          fclose(__stream);
          return 1;
        }
        printf("The number of lines (%d) is not divisible by 64.\n",(ulong)uVar5);
LAB_005d9077:
        fclose(__stream);
        return 0;
      }
      uVar4 = 0;
      uVar8 = uVar7;
      if (uVar2 == 10) {
        if (bVar3) {
          uVar8 = uVar10;
          if ((iVar6 != -1) && (uVar8 = uVar7, iVar6 != iVar9)) {
            printf("The number of symbols (%d) does not match other lines (%d).\n",uVar10,
                   uVar7 & 0xffffffff);
            goto LAB_005d9077;
          }
          uVar5 = uVar5 + 1;
          uVar4 = 0;
          iVar9 = 0;
        }
        goto LAB_005d9057;
      }
      bVar1 = false;
    } while (!bVar3);
    uVar4 = (uint)((uVar2 & 0xfffffffe) == 0x30);
LAB_005d9057:
    uVar10 = (ulong)(iVar9 + uVar4);
    uVar7 = uVar8;
  } while( true );
}

Assistant:

int Gia_ManSimParamRead( char * pFileName, int * pnIns, int * pnWords )
{
    int c, nIns = -1, nLines = 0, Count = 0, fReadDot = 0;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for reading.\n", pFileName );
        return 0;
    }
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '.' )
            fReadDot = 1;
        if ( c == '\n' )
        {
            if ( !fReadDot )
            {
                if ( nIns == -1 )
                    nIns = Count;
                else if ( nIns != Count )
                {
                    printf( "The number of symbols (%d) does not match other lines (%d).\n", Count, nIns );
                    fclose( pFile );
                    return 0;
                }
                Count = 0;
                nLines++;
            }
            fReadDot = 0;
        }
        if ( fReadDot )
            continue;
        if ( c != '0' && c != '1' )
            continue;
        Count++;
    }
    if ( nLines % 64 > 0 )
    {
        printf( "The number of lines (%d) is not divisible by 64.\n", nLines );
        fclose( pFile );
        return 0;
    }
    *pnIns = nIns - 1;
    *pnWords = nLines / 64;
    //printf( "Expecting %d inputs and %d words of simulation data.\n", *pnIns, *pnWords );
    fclose( pFile );
    return 1;
}